

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<Fad<double>_>::Subst_LForward(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  Fad<double> sum;
  Fad<double> local_a0;
  Fad<double> local_80;
  Fad<double> local_60;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_40;
  
  lVar11 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar11 != CONCAT44(extraout_var,iVar3)) ||
     ((this->super_TPZBaseMatrix).fDecomposed != '\x04')) {
    Error("TPZMatrix::Subst_LForward incompatible dimensions\n",(char *)0x0);
  }
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar3) != 0 && -1 < extraout_var_00) {
    lVar11 = 0;
    do {
      if (0 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol) {
        lVar10 = 0;
        do {
          local_80.val_ = 0.0;
          local_80.dx_.num_elts = 0;
          local_80.dx_.ptr_to_data = (double *)0x0;
          local_80.defaultVal = 0.0;
          if (lVar11 != 0) {
            lVar9 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_a0,this,lVar11,lVar9);
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_60,B,lVar9,lVar10);
              local_40.fadexpr_.left_ = &local_a0;
              local_40.fadexpr_.right_ = &local_60;
              Fad<double>::operator+=(&local_80,&local_40);
              Fad<double>::~Fad(&local_60);
              Fad<double>::~Fad(&local_a0);
              lVar9 = lVar9 + 1;
            } while (lVar11 != lVar9);
          }
          (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_60,B,lVar11,lVar10);
          iVar2 = local_60.dx_.num_elts;
          iVar3 = local_80.dx_.num_elts;
          local_a0.val_ = local_60.val_ - local_80.val_;
          uVar1 = local_80.dx_.num_elts;
          if (local_80.dx_.num_elts < local_60.dx_.num_elts) {
            uVar1 = local_60.dx_.num_elts;
          }
          local_a0.dx_.num_elts = 0;
          local_a0.dx_.ptr_to_data = (double *)0x0;
          if (0 < (int)uVar1) {
            local_a0.dx_.num_elts = uVar1;
            local_a0.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar1 * 8);
            uVar6 = 0;
            pdVar4 = local_60.dx_.ptr_to_data;
            pdVar5 = local_80.dx_.ptr_to_data;
            do {
              pdVar7 = pdVar4;
              if (iVar2 == 0) {
                pdVar7 = &local_60.defaultVal;
              }
              pdVar8 = pdVar5;
              if (iVar3 == 0) {
                pdVar8 = &local_80.defaultVal;
              }
              local_a0.dx_.ptr_to_data[uVar6] = *pdVar7 - *pdVar8;
              uVar6 = uVar6 + 1;
              pdVar5 = pdVar5 + 1;
              pdVar4 = pdVar4 + 1;
            } while (uVar1 != uVar6);
          }
          local_a0.defaultVal = 0.0;
          (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(B,lVar11,lVar10,&local_a0);
          Fad<double>::~Fad(&local_a0);
          Fad<double>::~Fad(&local_60);
          Fad<double>::~Fad(&local_80);
          lVar10 = lVar10 + 1;
        } while (lVar10 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol);
      }
      lVar11 = lVar11 + 1;
      iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    } while (lVar11 < CONCAT44(extraout_var_01,iVar3));
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt) {
		Error("TPZMatrix::Subst_LForward incompatible dimensions\n");
	}
    for ( int64_t r = 0; r < Dim(); r++ ) {
        for ( int64_t c = 0; c < B->Cols();  c++ )    {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
            //
            TVar sum = 0.0;
            for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}